

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

bool __thiscall capnp::SchemaLoader::Validator::validate(Validator *this,Reader *node)

{
  uint uVar1;
  void *pvVar2;
  uint64_t scopeId;
  undefined1 uVar3;
  ArrayPtr<const_char> AVar4;
  Fault f;
  anon_class_16_2_3fe397bd _kjContextFunc221;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_schema_loader_c__:221:5)>
  _kjContext221;
  Reader local_a8;
  anon_class_16_2_3fe397bd local_70;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_schema_loader_c__:221:5)>
  local_60;
  
  this->isValid = true;
  AVar4 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(node);
  (this->nodeName).super_StringPtr.content = AVar4;
  kj::
  Table<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry,_kj::TreeIndex<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Callbacks>_>
  ::clear(&(this->dependencies).table);
  local_70.this = this;
  local_70.node = node;
  kj::_::Debug::
  ContextImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++:221:5)>
  ::ContextImpl(&local_60,&local_70);
  capnp::schema::Node::Reader::getParameters((Reader *)&local_a8,node);
  uVar1 = (node->_reader).dataSize;
  if ((int)local_a8._reader.pointers == 0) {
    if (0x6f < uVar1) goto LAB_00429013;
  }
  else {
    if ((uVar1 < 0x121) || ((*(byte *)((long)(node->_reader).data + 0x24) & 1) == 0)) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[55]>
                ((Fault *)&local_a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0xe0,FAILED,"node.getIsGeneric()",
                 "\"if parameter list is non-empty, isGeneric must be true\"",
                 (char (*) [55])"if parameter list is non-empty, isGeneric must be true");
      this->isValid = false;
      kj::_::Debug::Fault::~Fault((Fault *)&local_a8);
      uVar3 = 0;
      goto LAB_0042911c;
    }
LAB_00429013:
    pvVar2 = (node->_reader).data;
    switch(*(undefined2 *)((long)pvVar2 + 0xc)) {
    case 1:
      local_a8._reader.segment = (node->_reader).segment;
      local_a8._reader.capTable = (node->_reader).capTable;
      local_a8._reader.data = (node->_reader).data;
      local_a8._reader.pointers = (node->_reader).pointers;
      local_a8._reader.dataSize = (node->_reader).dataSize;
      local_a8._reader.pointerCount = (node->_reader).pointerCount;
      local_a8._reader._38_2_ = *(undefined2 *)&(node->_reader).field_0x26;
      local_a8._reader.nestingLimit = (node->_reader).nestingLimit;
      local_a8._reader._44_4_ = *(undefined4 *)&(node->_reader).field_0x2c;
      if (uVar1 < 0xc0) {
        scopeId = 0;
      }
      else {
        scopeId = *(uint64_t *)((long)pvVar2 + 0x10);
      }
      validate(this,(Reader *)&local_a8,scopeId);
      break;
    case 2:
      local_a8._reader.segment = (node->_reader).segment;
      local_a8._reader.capTable = (node->_reader).capTable;
      local_a8._reader.data = (node->_reader).data;
      local_a8._reader.pointers = (node->_reader).pointers;
      local_a8._reader.dataSize = (node->_reader).dataSize;
      local_a8._reader.pointerCount = (node->_reader).pointerCount;
      local_a8._reader._38_2_ = *(undefined2 *)&(node->_reader).field_0x26;
      local_a8._reader.nestingLimit = (node->_reader).nestingLimit;
      local_a8._reader._44_4_ = *(undefined4 *)&(node->_reader).field_0x2c;
      validate(this,(Reader *)&local_a8);
      break;
    case 3:
      local_a8._reader.segment = (node->_reader).segment;
      local_a8._reader.capTable = (node->_reader).capTable;
      local_a8._reader.data = (node->_reader).data;
      local_a8._reader.pointers = (node->_reader).pointers;
      local_a8._reader.dataSize = (node->_reader).dataSize;
      local_a8._reader.pointerCount = (node->_reader).pointerCount;
      local_a8._reader._38_2_ = *(undefined2 *)&(node->_reader).field_0x26;
      local_a8._reader.nestingLimit = (node->_reader).nestingLimit;
      local_a8._reader._44_4_ = *(undefined4 *)&(node->_reader).field_0x2c;
      validate(this,(Reader *)&local_a8);
      break;
    case 4:
      local_a8._reader.segment = (node->_reader).segment;
      local_a8._reader.capTable = (node->_reader).capTable;
      local_a8._reader.data = (node->_reader).data;
      local_a8._reader.pointers = (node->_reader).pointers;
      local_a8._reader.dataSize = (node->_reader).dataSize;
      local_a8._reader.pointerCount = (node->_reader).pointerCount;
      local_a8._reader._38_2_ = *(undefined2 *)&(node->_reader).field_0x26;
      local_a8._reader.nestingLimit = (node->_reader).nestingLimit;
      local_a8._reader._44_4_ = *(undefined4 *)&(node->_reader).field_0x2c;
      validate(this,(Reader *)&local_a8);
      break;
    case 5:
      local_a8._reader.segment = (node->_reader).segment;
      local_a8._reader.capTable = (node->_reader).capTable;
      local_a8._reader.data = (node->_reader).data;
      local_a8._reader.pointers = (node->_reader).pointers;
      local_a8._reader.dataSize = (node->_reader).dataSize;
      local_a8._reader.pointerCount = (node->_reader).pointerCount;
      local_a8._reader._38_2_ = *(undefined2 *)&(node->_reader).field_0x26;
      local_a8._reader.nestingLimit = (node->_reader).nestingLimit;
      local_a8._reader._44_4_ = *(undefined4 *)&(node->_reader).field_0x2c;
      validate(this,&local_a8);
    }
  }
  uVar3 = this->isValid;
LAB_0042911c:
  kj::_::Debug::Context::~Context(&local_60.super_Context);
  return (bool)uVar3;
}

Assistant:

bool validate(const schema::Node::Reader& node) {
    isValid = true;
    nodeName = node.getDisplayName();
    dependencies.clear();

    KJ_CONTEXT("validating schema node", nodeName, (uint)node.which());

    if (node.getParameters().size() > 0) {
      KJ_REQUIRE(node.getIsGeneric(), "if parameter list is non-empty, isGeneric must be true") {
        isValid = false;
        return false;
      }
    }

    switch (node.which()) {
      case schema::Node::FILE:
        verifyVoid(node.getFile());
        break;
      case schema::Node::STRUCT:
        validate(node.getStruct(), node.getScopeId());
        break;
      case schema::Node::ENUM:
        validate(node.getEnum());
        break;
      case schema::Node::INTERFACE:
        validate(node.getInterface());
        break;
      case schema::Node::CONST:
        validate(node.getConst());
        break;
      case schema::Node::ANNOTATION:
        validate(node.getAnnotation());
        break;
    }

    // We accept and pass through node types we don't recognize.
    return isValid;
  }